

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

void __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *newset)

{
  int iVar1;
  pointer pnVar2;
  pointer pnVar3;
  long lVar4;
  long lVar5;
  int newdim;
  undefined4 *puVar6;
  undefined4 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  
  bVar11 = 0;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  lVar9 = (long)iVar1;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  add<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)this,&newset->
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            );
  newdim = (this->
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).set.thenum;
  if ((int)((ulong)((long)(this->left).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->left).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7) < newdim) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->left,newdim,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->right,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->object,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum,true);
    DataArray<int>::reSize
              (&this->scaleExp,
               (this->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thenum);
    newdim = (this->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thenum;
  }
  if (iVar1 < newdim) {
    lVar5 = 0;
    lVar8 = 0;
    lVar10 = lVar9;
    do {
      pnVar2 = (newset->left).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar3 = (this->left).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = (undefined4 *)((long)&(pnVar2->m_backend).data + lVar8);
      puVar7 = (undefined4 *)((long)&pnVar3[lVar9].m_backend.data + lVar8);
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar7 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      }
      *(undefined4 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x70) =
           *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x70);
      *(undefined1 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x74) =
           *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x74);
      *(undefined8 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x78) =
           *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x78);
      pnVar2 = (newset->right).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar3 = (this->right).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = (undefined4 *)((long)&(pnVar2->m_backend).data + lVar8);
      puVar7 = (undefined4 *)((long)&pnVar3[lVar9].m_backend.data + lVar8);
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar7 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      }
      *(undefined4 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x70) =
           *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x70);
      *(undefined1 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x74) =
           *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x74);
      *(undefined8 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x78) =
           *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x78);
      pnVar2 = (newset->object).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar3 = (this->object).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = (undefined4 *)((long)&(pnVar2->m_backend).data + lVar8);
      puVar7 = (undefined4 *)((long)&pnVar3[lVar9].m_backend.data + lVar8);
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar7 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      }
      *(undefined4 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x70) =
           *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x70);
      *(undefined1 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x74) =
           *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x74);
      *(undefined8 *)((long)&pnVar3[lVar9].m_backend.data + lVar8 + 0x78) =
           *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x78);
      (this->scaleExp).data[lVar10] = *(int *)((long)(newset->scaleExp).data + lVar5);
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x80;
      lVar5 = lVar5 + 4;
    } while (lVar10 < (this->
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).set.thenum);
  }
  return;
}

Assistant:

void add(const LPRowSetBase<R>& newset)
   {
      int i = num();

      SVSetBase<R>::add(newset);

      if(num() > left.dim())
      {
         left.reDim(num());
         right.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      for(int j = 0; i < num(); ++i, ++j)
      {
         left[i] = newset.lhs(j);
         right[i] = newset.rhs(j);
         object[i] = newset.obj(j);
         scaleExp[i] = newset.scaleExp[j];
      }
   }